

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execMovea<(moira::Instr)72,(moira::Mode)8,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  uint uVar2;
  ushort in_SI;
  u32 *in_RDI;
  u32 data;
  u32 ea;
  int dst;
  int src;
  u32 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar2 = (int)(uint)in_SI >> 9 & 7;
  bVar1 = readOp<(moira::Mode)8,(moira::Size)4,0ul>
                    ((Moira *)(CONCAT44((int)(uint)in_SI >> 9,in_stack_ffffffffffffffe8) &
                              0x7ffffffff),in_stack_ffffffffffffffe4,in_RDI,
                     (u32 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (bVar1) {
    prefetch<4ul>((Moira *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    SEXT<(moira::Size)4>((ulong)in_stack_ffffffffffffffe4);
    writeA<(moira::Size)4>
              ((Moira *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
               in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void
Moira::execMovea(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea, data;
    if (!readOp <M,S, STD_AE_FRAME> (src, ea, data)) return;

    prefetch<POLLIPL>();
    writeA(dst, SEXT<S>(data));
}